

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O0

void __thiscall memory_io_buf::memory_io_buf(memory_io_buf *this)

{
  undefined8 *in_RDI;
  int *in_stack_ffffffffffffffc8;
  v_array<int> *this_00;
  
  io_buf::io_buf((io_buf *)0x1a6b68);
  *in_RDI = &PTR_open_file_00516800;
  this_00 = (v_array<int> *)(in_RDI + 0x15);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x1a6b88);
  in_RDI[0x18] = 0;
  v_array<int>::push_back(this_00,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

memory_io_buf() : readOffset(0) {
        files.push_back(-1); // this is a hack because buf will do nothing if files is empty
    }